

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O0

void ur_kpss(double *y,int N,char *type,int lshort,int *klag,double *statistic,double *pval)

{
  int iVar1;
  double dVar2;
  double local_c8;
  double tablep [4];
  reg_object local_a0;
  reg_object fit;
  double yhi;
  double ylo;
  double s2;
  double eta;
  double alpha;
  double *csum;
  double *varcovar;
  double *table;
  double *res;
  double *tt;
  int local_40;
  int l;
  int p;
  int i;
  double *statistic_local;
  int *klag_local;
  char *pcStack_20;
  int lshort_local;
  char *type_local;
  double *pdStack_10;
  int N_local;
  double *y_local;
  
  local_c8 = 0.01;
  tablep[0] = 0.025;
  tablep[1] = 0.05;
  tablep[2] = 0.1;
  _p = statistic;
  statistic_local = (double *)klag;
  klag_local._4_4_ = lshort;
  pcStack_20 = type;
  type_local._4_4_ = N;
  pdStack_10 = y;
  res = (double *)malloc((long)N << 3);
  table = (double *)malloc((long)type_local._4_4_ << 3);
  varcovar = (double *)malloc(0x20);
  alpha = (double)malloc((long)type_local._4_4_ << 3);
  for (l = 1; l <= type_local._4_4_; l = l + 1) {
    res[l + -1] = (double)l;
  }
  eta = 0.95;
  iVar1 = strcmp(pcStack_20,"trend");
  if (iVar1 == 0) {
    *varcovar = 0.216;
    varcovar[1] = 0.176;
    varcovar[2] = 0.146;
    varcovar[3] = 0.119;
    local_40 = 2;
    csum = (double *)malloc(0x20);
    local_a0 = reg_init(type_local._4_4_,local_40);
    regress(local_a0,res,pdStack_10,table,csum,eta);
  }
  else {
    iVar1 = strcmp(pcStack_20,"level");
    if (iVar1 != 0) {
      printf("kpss only accepts two types - level and trend. \n");
      exit(-1);
    }
    *varcovar = 0.739;
    varcovar[1] = 0.574;
    varcovar[2] = 0.463;
    varcovar[3] = 0.347;
    local_40 = 1;
    csum = (double *)malloc(8);
    local_a0 = reg_init(type_local._4_4_,local_40);
    regress(local_a0,(double *)0x0,pdStack_10,table,csum,eta);
  }
  cumsum(table,type_local._4_4_,(double *)alpha);
  ylo = 0.0;
  s2 = 0.0;
  for (l = 0; l < type_local._4_4_; l = l + 1) {
    s2 = *(double *)((long)alpha + (long)l * 8) * *(double *)((long)alpha + (long)l * 8) + s2;
    ylo = table[l] * table[l] + ylo;
  }
  s2 = s2 / (double)(type_local._4_4_ * type_local._4_4_);
  ylo = ylo / (double)type_local._4_4_;
  if (klag_local._4_4_ == 1) {
    dVar2 = pow((double)type_local._4_4_ / 100.0,0.25);
    dVar2 = dVar2 * 4.0;
  }
  else {
    dVar2 = pow((double)type_local._4_4_ / 100.0,0.25);
    dVar2 = dVar2 * 12.0;
  }
  tt._4_4_ = (int)dVar2;
  if ((statistic_local != (double *)0x0) && (0 < *(int *)statistic_local)) {
    tt._4_4_ = *(int *)statistic_local;
  }
  ppsum(table,type_local._4_4_,tt._4_4_,&ylo);
  *_p = s2 / ylo;
  arrayminmax(varcovar,4,&yhi,(double *)&fit);
  dVar2 = interpolate_linear(varcovar,&local_c8,4,*_p);
  *pval = dVar2;
  if (statistic_local != (double *)0x0) {
    *(int *)statistic_local = tt._4_4_;
  }
  free(varcovar);
  free(res);
  free(table);
  free((void *)alpha);
  free(csum);
  free_reg(local_a0);
  return;
}

Assistant:

void ur_kpss(double *y, int N,const char* type,int lshort, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    type - "level" or "trend"
    lshort - determines the length of lag used. lshort = 1 => lag = 4.0 * pow(((double) N)/100.0,0.25)
    else lag = 12.0 * pow(((double) N)/100.0,0.25). It can be bypassed by parameter klag
    klag - Length of the lag. Set it to > 0 instead of NULL if you wnat it to bypass lshort. Set it to NULL or negative otherwise

    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int i,p,l;
    double *tt,*res,*table,*varcovar,*csum;
    double alpha,eta,s2,ylo,yhi;
    reg_object fit;

    double tablep[4] = {0.01, 0.025, 0.05, 0.10};

    tt = (double*)malloc(sizeof(double)*N);
    res = (double*)malloc(sizeof(double)*N);
    table = (double*)malloc(sizeof(double)*4);
    csum = (double*)malloc(sizeof(double)*N);

    for(i = 1; i <= N;++i) {
        tt[i-1] = (double) i;
    }

    alpha = 0.95;

    if (!strcmp(type,"trend")) {
            table[0] = 0.216; table[1] = 0.176; table[2] = 0.146; table[3] = 0.119;
            p = 2;
            varcovar = (double*)malloc(sizeof(double)*p*p);

            fit = reg_init(N,p);
            regress(fit,tt,y,res,varcovar,alpha);

        } else if (!strcmp(type,"level")) {
            table[0] = 0.739; table[1] = 0.574; table[2] = 0.463; table[3] = 0.347;
            p = 1;
            varcovar = (double*)malloc(sizeof(double)*p*p);

            fit = reg_init(N,p);
            regress(fit,NULL,y,res,varcovar,alpha);
    } else {
        printf("kpss only accepts two types - level and trend. \n");
        exit(-1);
    }

    cumsum(res,N,csum);

    eta = s2 = 0.0;

    for(i = 0; i < N;++i) {
        eta += (csum[i] * csum[i]);
        s2 += (res[i] * res[i]);
    }

    eta /= (double) (N*N);
    s2 /= (double) N;

    if (lshort == 1) {
        l = (int) 4.0 * pow(((double) N)/100.0,0.25);
    } else {
        l = (int) 12.0 * pow(((double) N)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        l = *klag;
    }

    ppsum(res,N,l,&s2);

    *statistic = eta/s2;

    arrayminmax(table,4,&ylo,&yhi);

    *pval = interpolate_linear(table,tablep,4,*statistic);

    if (klag != NULL) *klag = l;

    free(table);
    free(tt);
    free(res);
    free(csum);
    free(varcovar);
    free_reg(fit);
}